

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_BoolOnlyFlag_Test::~TApp_BoolOnlyFlag_Test(TApp_BoolOnlyFlag_Test *this)

{
  TApp_BoolOnlyFlag_Test *this_local;
  
  ~TApp_BoolOnlyFlag_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, BoolOnlyFlag) {
    bool bflag;
    app.add_flag("-b", bflag)->multi_option_policy(CLI::MultiOptionPolicy::Throw);

    args = {"-b"};
    EXPECT_NO_THROW(run());
    EXPECT_TRUE(bflag);

    app.reset();

    args = {"-b", "-b"};
    EXPECT_THROW(run(), CLI::ConversionError);
}